

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightBounds * __thiscall pbrt::PointLight::Bounds(PointLight *this)

{
  DenselySampledSpectrum *this_00;
  long in_RSI;
  LightBounds *in_RDI;
  undefined1 auVar1 [64];
  Point3<float> PVar3;
  Point3f p;
  Point3<float> *in_stack_00000138;
  Transform *in_stack_00000140;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar4;
  LightBounds *p_00;
  LightBounds *in_stack_ffffffffffffffc0;
  undefined1 auVar2 [56];
  
  this_00 = (DenselySampledSpectrum *)(in_RSI + 0x18);
  auVar2 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  p_00 = in_RDI;
  Point3<float>::Point3
            ((Point3<float> *)this_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0.0);
  PVar3 = Transform::operator()(in_stack_00000140,in_stack_00000138);
  auVar1._0_8_ = PVar3.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar2;
  vmovlpd_avx(auVar1._0_16_);
  Vector3<float>::Vector3
            ((Vector3<float> *)this_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0.0);
  fVar4 = *(float *)(in_RSI + 0xc0) * 12.566371;
  DenselySampledSpectrum::MaxValue(this_00);
  LightBounds::LightBounds
            (in_stack_ffffffffffffffc0,(Point3f *)p_00,
             (Vector3f *)CONCAT44(fVar4,in_stack_ffffffffffffffb0),(Float)((ulong)in_RDI >> 0x20),
             SUB84(in_RDI,0),(Float)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  return p_00;
}

Assistant:

LightBounds PointLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    return LightBounds(p, Vector3f(0, 0, 1), 4 * Pi * scale * I.MaxValue(), Pi, Pi / 2,
                       false);
}